

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 34_findFirstAndLastPositionInSortedArray.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
searchRange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
           vector<int,_std::allocator<int>_> *nums,int target)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_29;
  int local_28;
  int local_24;
  int local_20 [2];
  
  piVar1 = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = (ulong)((long)(nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  local_24 = 0;
  local_28 = 0;
  if (0 < (int)uVar2) {
    local_28 = 0;
    uVar3 = uVar2 & 0xffffffff;
    do {
      uVar5 = (uint)(local_28 + (int)uVar3) >> 1;
      uVar4 = (ulong)uVar5;
      if (piVar1[uVar4] < target) {
        local_28 = uVar5 + 1;
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
    } while (local_28 < (int)uVar4);
  }
  if (0 < (int)uVar2) {
    local_24 = 0;
    do {
      uVar5 = (uint)(local_24 + (int)uVar2) >> 1;
      uVar3 = (ulong)uVar5;
      if (piVar1[uVar3] <= target) {
        local_24 = uVar5 + 1;
        uVar3 = uVar2;
      }
      uVar2 = uVar3;
    } while (local_24 < (int)uVar3);
  }
  if (local_28 == local_24) {
    local_20[0] = -1;
    local_20[1] = -1;
    __l._M_len = 2;
    __l._M_array = local_20;
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_29);
  }
  else {
    local_24 = local_24 + -1;
    __l_00._M_len = 2;
    __l_00._M_array = &local_28;
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l_00,&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> searchRange(vector<int>& nums, int target) {
    int start=0,end=nums.size(),mid,left,right;
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<=nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    left=start;
    start=0,end=nums.size();
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    right=start;
    return left==right ? vector<int> {-1,-1} : vector<int>{left,right-1};
}